

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
boost::unit_test::operator+
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          basic_cstring<const_char> *rhs)

{
  basic_cstring<const_char> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI,(string *)in_RSI);
  basic_cstring<const_char>::begin(in_RDX);
  basic_cstring<const_char>::end(in_RDX);
  std::__cxx11::string::append<char_const*,void>
            (in_RSI,(char *)in_RDX,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  return in_RDI;
}

Assistant:

inline std::basic_string<CharT1>
operator+( std::basic_string<CharT1> const& lhs, basic_cstring<CharT2> const& rhs )
{
    std::basic_string<CharT1> res( lhs );

    res.append( rhs.begin(), rhs.end() );
    return res;
}